

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_file.cpp
# Opt level: O3

bool __thiscall csguide_webserver::INIFile::Save(INIFile *this,string *file_path)

{
  pointer pIVar1;
  char cVar2;
  ostream *poVar3;
  INISection *section;
  pointer section_00;
  ofstream ofs;
  char local_229;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(string *)file_path,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    section_00 = (this->sections_).
                 super__Vector_base<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (this->sections_).
             super__Vector_base<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (section_00 != pIVar1) {
      do {
        poVar3 = operator<<((ostream *)&local_228,section_00);
        local_229 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_229,1);
        section_00 = section_00 + 1;
      } while (section_00 != pIVar1);
    }
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return (bool)cVar2;
}

Assistant:

bool INIFile::Save(const std::string& file_path) const {
  std::ofstream ofs(file_path);
  if (!ofs.is_open()) {
    return false;
  }

  for (const auto& section : sections_) {
    ofs << section << '\n';
  }

  return true;
}